

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O1

void __thiscall
FRemapTable::AddDesaturation
          (FRemapTable *this,int start,int end,double r1,double g1,double b1,double r2,double g2,
          double b2)

{
  byte bVar1;
  BYTE BVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_68;
  double local_60;
  
  if (2.0 <= r1) {
    r1 = 2.0;
  }
  if (r1 <= 0.0) {
    r1 = 0.0;
  }
  if (2.0 <= g1) {
    g1 = 2.0;
  }
  if (g1 <= 0.0) {
    g1 = 0.0;
  }
  if (2.0 <= b1) {
    b1 = 2.0;
  }
  if (b1 <= 0.0) {
    b1 = 0.0;
  }
  if (2.0 <= r2) {
    r2 = 2.0;
  }
  if (r2 <= 0.0) {
    r2 = 0.0;
  }
  if (2.0 <= g2) {
    g2 = 2.0;
  }
  if (g2 <= 0.0) {
    g2 = 0.0;
  }
  if (2.0 <= b2) {
    b2 = 2.0;
  }
  if (b2 <= 0.0) {
    b2 = 0.0;
  }
  dVar11 = b2;
  dVar12 = r1;
  dVar13 = g1;
  iVar9 = end;
  iVar3 = start;
  local_68 = g2;
  local_60 = r2;
  if (end < start) {
    dVar11 = b1;
    dVar12 = r2;
    dVar13 = g2;
    b1 = b2;
    iVar9 = start;
    iVar3 = end;
    local_68 = g1;
    local_60 = r1;
  }
  if (iVar3 <= iVar9) {
    if (end < start) {
      start = end;
    }
    lVar4 = (long)start;
    lVar7 = 0;
    do {
      dVar10 = (double)((uint)GPalette.BaseColors[lVar4 + lVar7].field_0.field_0.b * 0x25 +
                       (uint)*(byte *)(lVar4 * 4 + 0x1bfada1 + lVar7 * 4) * 0x8f +
                       (uint)*(byte *)(lVar4 * 4 + 0x1bfada2 + lVar7 * 4) * 0x4d) * 0.00390625;
      uVar8 = (uint)(dVar10 * (local_60 - dVar12) + dVar12 * 255.0);
      if (0xfe < (int)uVar8) {
        uVar8 = 0xff;
      }
      uVar6 = (uint)(dVar10 * (local_68 - dVar13) + dVar13 * 255.0);
      if (0xfe < (int)uVar6) {
        uVar6 = 0xff;
      }
      uVar5 = (uint)(dVar10 * (dVar11 - b1) + b1 * 255.0);
      if (0xfe < (int)uVar5) {
        uVar5 = 0xff;
      }
      bVar1 = *(byte *)(lVar4 + 0x1bfb1a0 + lVar7);
      BVar2 = FColorMatcher::Pick(&ColorMatcher,uVar8 & 0xff,uVar6 & 0xff,uVar5 & 0xff);
      this->Remap[bVar1] = BVar2;
      *(uint *)((long)&this->Palette->field_0 + (ulong)((uint)bVar1 * 4)) =
           (uVar6 & 0xff) << 8 | (uVar8 & 0xff) << 0x10 | uVar5 & 0xff;
      *(char *)((long)&this->Palette->field_0 + (ulong)((uint)bVar1 * 4) + 3) = -(bVar1 != 0);
      lVar7 = lVar7 + 1;
    } while ((iVar9 - start) + 1 != (int)lVar7);
  }
  return;
}

Assistant:

void FRemapTable::AddDesaturation(int start, int end, double r1, double g1, double b1, double r2, double g2, double b2)
{
	r1 = clamp(r1, 0.0, 2.0);
	g1 = clamp(g1, 0.0, 2.0);
	b1 = clamp(b1, 0.0, 2.0);
	r2 = clamp(r2, 0.0, 2.0);
	g2 = clamp(g2, 0.0, 2.0);
	b2 = clamp(b2, 0.0, 2.0);

	if (start > end)
	{
		swapvalues(start, end);
		swapvalues(r1, r2);
		swapvalues(g1, g2);
		swapvalues(b1, b2);
	}

	r2 -= r1;
	g2 -= g1;
	b2 -= b1;
	r1 *= 255;
	g1 *= 255;
	b1 *= 255;

	for(int c = start; c <= end; c++)
	{
		double intensity = (GPalette.BaseColors[c].r * 77 +
							GPalette.BaseColors[c].g * 143 +
							GPalette.BaseColors[c].b * 37) / 256.0;

		PalEntry pe = PalEntry(	MIN(255, int(r1 + intensity*r2)), 
								MIN(255, int(g1 + intensity*g2)), 
								MIN(255, int(b1 + intensity*b2)));

		int cc = GPalette.Remap[c];

		Remap[cc] = ColorMatcher.Pick(pe);
		Palette[cc] = pe;
		Palette[cc].a = cc == 0 ? 0:255;
	}
}